

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

_Bool option_toggle_handle(menu_conflict *m,ui_event *event,wchar_t oid)

{
  _Bool _Var1;
  char *pcVar2;
  char local_2e;
  char local_2d;
  int local_2c;
  char dummy_1;
  char dummy;
  wchar_t page;
  _Bool next;
  ui_event *puStack_20;
  wchar_t oid_local;
  ui_event *event_local;
  menu_conflict *m_local;
  
  dummy = '\0';
  page = oid;
  puStack_20 = event;
  event_local = (ui_event *)m;
  local_2c = option_type(oid);
  if (puStack_20->type == EVT_SELECT) {
    if ((local_2c != 1) || (*(int *)((long)event_local + 0x50) != 2)) {
      pcVar2 = option_name(page);
      option_set(pcVar2,(uint)(((player->opts).opt[page] ^ 0xffU) & 1));
    }
  }
  else {
    if (puStack_20->type != EVT_KBRD) {
      return false;
    }
    if (((puStack_20->key).code == 0x79) || ((puStack_20->key).code == 0x59)) {
      pcVar2 = option_name(page);
      option_set(pcVar2,1);
      dummy = '\x01';
    }
    else if (((puStack_20->key).code == 0x6e) || ((puStack_20->key).code == 0x4e)) {
      pcVar2 = option_name(page);
      option_set(pcVar2,0);
      dummy = '\x01';
    }
    else if (((puStack_20->key).code == 0x74) || ((puStack_20->key).code == 0x54)) {
      pcVar2 = option_name(page);
      option_set(pcVar2,(uint)(((player->opts).opt[page] ^ 0xffU) & 1));
    }
    else if (((puStack_20->key).code == 0x73) || ((puStack_20->key).code == 0x53)) {
      screen_save();
      _Var1 = options_save_custom(&player->opts,local_2c);
      if (_Var1) {
        get_com("Successfully saved.  Press any key to continue.",&local_2d);
      }
      else {
        get_com("Save failed.  Press any key to continue.",&local_2d);
      }
      screen_load();
    }
    else if ((((puStack_20->key).code == 0x72) || ((puStack_20->key).code == 0x52)) &&
            ((local_2c != 1 || (*(int *)((long)event_local + 0x50) == 0x10)))) {
      screen_save();
      _Var1 = options_restore_custom(&player->opts,local_2c);
      if (_Var1) {
        screen_load();
        menu_refresh((menu_conflict *)&event_local->mouse,false);
      }
      else {
        get_com("Restore failed.  Press any key to continue.",&local_2e);
        screen_load();
      }
    }
    else {
      if ((((puStack_20->key).code != 0x78) && ((puStack_20->key).code != 0x58)) ||
         ((local_2c == 1 && (*(int *)((long)event_local + 0x50) != 0x10)))) {
        return false;
      }
      options_restore_maintainer(&player->opts,local_2c);
      menu_refresh((menu_conflict *)&event_local->mouse,false);
    }
  }
  if ((dummy & 1U) != 0) {
    event_local[0xc].type = event_local[0xc].type + EVT_KBRD;
    event_local[0xc].type =
         (int)(event_local[0xc].type + *(int *)((long)event_local + 100)) %
         *(int *)((long)event_local + 100);
  }
  return true;
}

Assistant:

static bool option_toggle_handle(struct menu *m, const ui_event *event,
		int oid)
{
	bool next = false;
	int page = option_type(oid);

	if (event->type == EVT_SELECT) {
		/* Hack -- birth options can not be toggled after birth */
		/* At birth, m->flags == MN_DBL_TAP. */
		/* After birth, m->flags == MN_NO_TAGS */
		if (!((page == OP_BIRTH) && (m->flags == MN_NO_TAGS))) {
			option_set(option_name(oid), !player->opts.opt[oid]);
		}
	} else if (event->type == EVT_KBRD) {
		if (event->key.code == 'y' || event->key.code == 'Y') {
			option_set(option_name(oid), true);
			next = true;
		} else if (event->key.code == 'n' || event->key.code == 'N') {
			option_set(option_name(oid), false);
			next = true;
		} else if (event->key.code == 't' || event->key.code == 'T') {
			option_set(option_name(oid), !player->opts.opt[oid]);
		} else if (event->key.code == 's' || event->key.code == 'S') {
			char dummy;

			screen_save();
			if (options_save_custom(&player->opts, page)) {
				get_com("Successfully saved.  Press any key to continue.", &dummy);
			} else {
				get_com("Save failed.  Press any key to continue.", &dummy);
			}
			screen_load();
		/*
		 * For birth options, only allow restore from custom defaults
		 * at birth.
		 */
		} else if ((event->key.code == 'r' || event->key.code == 'R') &&
				(page != OP_BIRTH || m->flags == MN_DBL_TAP)) {
			screen_save();
			if (options_restore_custom(&player->opts, page)) {
				screen_load();
				menu_refresh(m, false);
			} else {
				char dummy;

				get_com("Restore failed.  Press any key to continue.", &dummy);
				screen_load();
			}
		/*
		 * For birth options, only allow restore to the maintainer's
		 * defaults at birth.
		 */
		} else if ((event->key.code == 'x' || event->key.code == 'X') &&
				(page != OP_BIRTH || m->flags == MN_DBL_TAP)) {
			options_restore_maintainer(&player->opts, page);
			menu_refresh(m, false);
		} else {
			return false;
		}
	} else {
		return false;
	}

	if (next) {
		m->cursor++;
		m->cursor = (m->cursor + m->filter_count) % m->filter_count;
	}

	return true;
}